

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::updateCursor(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  QStyle *pQVar1;
  QProxyStyle *this_01;
  long lVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QCursor QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar1 = QWidget::style(this_00);
  this_01 = (QProxyStyle *)QMetaObject::cast((QObject *)&QProxyStyle::staticMetaObject);
  if (this_01 != (QProxyStyle *)0x0) {
    pQVar1 = QProxyStyle::baseStyle(this_01);
  }
  lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QMacStyle");
  if (lVar2 == 0) {
    if (this->currentOperation != Move) {
      if (this->currentOperation == None) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QWidget::unsetCursor(this_00);
          return;
        }
        goto LAB_0044af3f;
      }
      iVar3 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                        (&this->operationMap,&this->currentOperation);
      if (*(char *)((long)iVar3.i._M_node + 0x38) != '\x01') goto LAB_0044af25;
    }
    iVar3 = QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::find
                      (&this->operationMap,&this->currentOperation);
    QCursor::QCursor(&QStack_28,*(CursorShape *)((long)iVar3.i._M_node + 0x2c));
    QWidget::setCursor(this_00,&QStack_28);
    QCursor::~QCursor(&QStack_28);
  }
LAB_0044af25:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0044af3f:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateCursor()
{
#ifndef QT_NO_CURSOR
    Q_Q(QMdiSubWindow);
    if (isMacStyle(q->style()))
        return;

    if (currentOperation == None) {
        q->unsetCursor();
        return;
    }

    if (currentOperation == Move || operationMap.find(currentOperation).value().hover) {
        q->setCursor(operationMap.find(currentOperation).value().cursorShape);
        return;
    }
#endif
}